

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_after_RFQ_toggle_only_adds_unsubscribe_and_refresh_control_with_correct_SID_Test
::TestBody(SubjectSetRegisterTest_next_subscription_sync_after_RFQ_toggle_only_adds_unsubscribe_and_refresh_control_with_correct_SID_Test
           *this)

{
  bool bVar1;
  map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  *this_00;
  pointer ppVar2;
  char *message_00;
  AssertHelper local_238;
  Message local_230;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>
  local_228;
  ControlOperationEnum local_21c;
  undefined1 local_218 [8];
  AssertionResult gtest_ar;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> message;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> local_180;
  Subject local_110 [24];
  Subject local_f8 [24];
  Subject local_e0 [40];
  Subject local_b8 [24];
  SubjectSetRegister local_a0 [8];
  SubjectSetRegister subject_register;
  SubjectSetRegisterTest_next_subscription_sync_after_RFQ_toggle_only_adds_unsubscribe_and_refresh_control_with_correct_SID_Test
  *this_local;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(local_a0);
  bidfx_public_api::price::subject::Subject::Subject(local_b8,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_b8,0);
  subject::Subject::~Subject(local_b8);
  bidfx_public_api::price::subject::Subject::Subject(local_e0,(Subject *)SS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_e0,0);
  subject::Subject::~Subject(local_e0);
  bidfx_public_api::price::subject::Subject::Subject(local_f8,(Subject *)SS_RFQ_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_f8,0);
  subject::Subject::~Subject(local_f8);
  bidfx_public_api::price::subject::Subject::Subject(local_110,(Subject *)SS_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_110,0);
  subject::Subject::~Subject(local_110);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional(&local_180);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_a0);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)
             &message.
              super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
              _M_payload.
              super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
              .super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>.
              _M_engaged,(Subject *)SS_RFQ_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register
            (local_a0,&message.
                       super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>
                       ._M_payload.
                       super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
                       .
                       super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>
                       ._M_engaged,0);
  subject::Subject::~Subject
            ((Subject *)
             &message.
              super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
              _M_payload.
              super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
              .super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>.
              _M_engaged);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  local_21c = TOGGLE;
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::operator->
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar.message_);
  this_00 = (map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
             *)bidfx_public_api::price::pixie::SubscriptionSync::GetControls();
  local_228._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
       ::begin(this_00);
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>
           ::operator->(&local_228);
  testing::internal::EqHelper<false>::
  Compare<bidfx_public_api::price::pixie::ControlOperationEnum,bidfx_public_api::price::pixie::ControlOperationEnum>
            ((EqHelper<false> *)local_218,"ControlOperationEnum::TOGGLE",
             "message->GetControls().begin()->second",&local_21c,&ppVar2->second);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x2a2,message_00);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar.message_);
  SubjectSetRegister::~SubjectSetRegister(local_a0);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_after_RFQ_toggle_only_adds_unsubscribe_and_refresh_control_with_correct_SID)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT0, false);
    subject_register.Register(SS_SUBJECT1, false);
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    subject_register.Register(SS_SUBJECT3, false);
    subject_register.NextSubscriptionSync();

    subject_register.Unregister(SS_RFQ_SUBJECT3);
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();

    EXPECT_EQ(ControlOperationEnum::TOGGLE, message->GetControls().begin()->second);
}